

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# on_off_sketch.h
# Opt level: O3

void __thiscall
OO_FPI<8U>::Check(OO_FPI<8U> *this,HashMap<8U> *mp,
                 vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 *outs)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  ostream *poVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  _Hash_node_base *p_Var18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar24 [32];
  
  p_Var18 = (mp->_M_h)._M_before_begin._M_nxt;
  if (p_Var18 == (_Hash_node_base *)0x0) {
    auVar19 = (undefined1  [16])0x0;
    auVar20 = ZEXT816(0) << 0x40;
  }
  else {
    iVar14 = 0;
    iVar16 = 0;
    uVar17 = 0;
    do {
      iVar11 = Query(this,(Data<8U>)p_Var18[1]._M_nxt);
      iVar5 = *(int *)&p_Var18[2]._M_nxt;
      iVar6 = this->HIT;
      if ((iVar6 < iVar5) && (iVar16 = iVar16 + 1, iVar6 < iVar11)) {
        iVar14 = iVar14 + 1;
        iVar13 = iVar5 - iVar11;
        iVar15 = -iVar13;
        if (0 < iVar13) {
          iVar15 = iVar13;
        }
        auVar22._0_8_ = (double)iVar15;
        auVar22._8_8_ = in_XMM2_Qb;
        auVar19._0_8_ = auVar22._0_8_ / (double)iVar5;
        auVar19._8_8_ = in_XMM2_Qb;
        auVar19 = vunpcklpd_avx(auVar22,auVar19);
        (this->super_Abstract<8U>).aae = auVar19._0_8_ + (this->super_Abstract<8U>).aae;
        (this->super_Abstract<8U>).are = auVar19._8_8_ + (this->super_Abstract<8U>).are;
      }
      uVar17 = uVar17 + (iVar6 < iVar11);
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
    auVar20._0_8_ = (double)iVar14;
    auVar20._8_8_ = in_XMM2_Qb;
    auVar19 = vpinsrd_avx(ZEXT416(uVar17),iVar16,1);
  }
  auVar10._8_4_ = 1;
  auVar10._0_8_ = 0x100000001;
  auVar10._12_4_ = 1;
  auVar19 = vpmaxsd_avx512vl(auVar19,auVar10);
  auVar19 = vcvtdq2pd_avx(auVar19);
  uVar3 = (this->super_Abstract<8U>).aae;
  uVar4 = (this->super_Abstract<8U>).are;
  auVar24._24_8_ = uVar4;
  auVar24._16_8_ = uVar3;
  auVar24._0_16_ = auVar20;
  auVar21._0_8_ = auVar20._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  auVar21._16_8_ = auVar21._0_8_;
  auVar21._24_8_ = auVar21._0_8_;
  auVar24 = vblendpd_avx(auVar21,auVar24,0xc);
  auVar21 = vblendpd_avx(auVar21,ZEXT1632(auVar19),3);
  auVar24 = vdivpd_avx(auVar24,auVar21);
  (this->super_Abstract<8U>).pr = (double)auVar24._0_8_;
  (this->super_Abstract<8U>).cr = (double)auVar24._8_8_;
  (this->super_Abstract<8U>).aae = (double)auVar24._16_8_;
  (this->super_Abstract<8U>).are = (double)auVar24._24_8_;
  auVar19 = vshufpd_avx(auVar24._0_16_,auVar24._0_16_,1);
  poVar12 = std::ostream::_M_insert<double>(auVar19._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
  poVar12 = std::ostream::_M_insert<double>((this->super_Abstract<8U>).pr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
  dVar1 = (this->super_Abstract<8U>).pr;
  dVar2 = (this->super_Abstract<8U>).cr;
  dVar7 = dVar1 + dVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar7;
  uVar8 = vcmpsd_avx512f(auVar23,ZEXT816(0x3e112e0be826d695),1);
  bVar9 = (bool)((byte)uVar8 & 1);
  poVar12 = std::ostream::_M_insert<double>
                      (((dVar1 + dVar1) * dVar2) /
                       (double)((ulong)bVar9 * 0x3ff0000000000000 + (ulong)!bVar9 * (long)dVar7));
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
  poVar12 = std::ostream::_M_insert<double>((this->super_Abstract<8U>).are);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = Query(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)std::max(1, all);
		this->pr = hit / (double)std::max(1, size);
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		*outs[3] << this->are << ",";
	}